

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

Filter * helics::registerFilter
                   (Federate *fed,bool global,bool cloning,string_view name,string_view inputType,
                   string_view outputType)

{
  string_view inputType_00;
  string_view inputType_01;
  string_view inputType_02;
  string_view inputType_03;
  string_view filterName;
  string_view filterName_00;
  string_view filterName_01;
  string_view filterName_02;
  string_view outputType_00;
  string_view outputType_01;
  string_view outputType_02;
  string_view outputType_03;
  string_view filterName_03;
  string_view filterName_04;
  string_view filterName_05;
  string_view filterName_06;
  string_view outputType_04;
  string_view outputType_05;
  string_view outputType_06;
  string_view outputType_07;
  bool bVar1;
  size_t in_RCX;
  byte in_DL;
  byte in_SIL;
  undefined8 in_R8;
  bool useTypes;
  Filter *local_1f8;
  Filter *local_1e0;
  Filter *local_1d8;
  Federate *in_stack_fffffffffffffe30;
  basic_string_view<char,_std::char_traits<char>_> *this;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 uVar2;
  char *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  Federate *in_stack_fffffffffffffe90;
  string_view in_stack_fffffffffffffe98;
  size_t in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  size_t local_f8;
  undefined8 local_f0;
  size_t local_e8;
  char *local_e0;
  size_t local_d8;
  char *local_d0;
  size_t local_c8;
  undefined8 local_c0;
  size_t local_b8;
  char *local_b0;
  size_t local_a8;
  char *local_a0;
  size_t local_98;
  undefined8 local_90;
  size_t local_88;
  char *local_80;
  size_t local_78;
  char *local_70;
  size_t local_68;
  undefined8 local_60;
  size_t local_58;
  char *local_50;
  size_t local_48;
  char *local_40;
  size_t local_38;
  undefined8 local_30;
  byte local_23;
  byte local_22;
  byte local_21;
  size_t local_18;
  undefined8 local_10;
  Filter *local_8;
  
  this = (basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000018;
  this_00 = (basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008;
  local_21 = in_SIL & 1;
  local_22 = in_DL & 1;
  local_18 = in_RCX;
  local_10 = in_R8;
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(this_00);
  uVar2 = false;
  if (bVar1) {
    uVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(this);
  }
  local_23 = (uVar2 ^ 0xff) & 1;
  if (local_23 == 0) {
    if ((local_22 & 1) == 0) {
      if ((local_21 & 1) == 0) {
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffe68);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffe58);
        filterName_06._M_str = in_stack_fffffffffffffeb0;
        filterName_06._M_len = in_stack_fffffffffffffea8;
        outputType_07._M_str = in_stack_fffffffffffffec8;
        outputType_07._M_len = (size_t)in_stack_fffffffffffffec0;
        local_1f8 = Federate::registerFilter
                              (in_stack_fffffffffffffe90,filterName_06,in_stack_fffffffffffffe98,
                               outputType_07);
      }
      else {
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffe98);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffe88);
        filterName_02._M_str._0_7_ = in_stack_fffffffffffffe50;
        filterName_02._M_len = (size_t)this_00;
        filterName_02._M_str._7_1_ = uVar2;
        inputType_03._M_str = (char *)this;
        inputType_03._M_len = in_RCX;
        outputType_03._M_str = in_stack_fffffffffffffe68;
        outputType_03._M_len = (size_t)in_stack_fffffffffffffe60;
        local_1f8 = Federate::registerGlobalFilter
                              (in_stack_fffffffffffffe30,filterName_02,inputType_03,outputType_03);
      }
      local_8 = local_1f8;
    }
    else {
      if ((local_21 & 1) == 0) {
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffec8);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffeb8);
        filterName_05._M_str = in_stack_fffffffffffffeb0;
        filterName_05._M_len = in_stack_fffffffffffffea8;
        outputType_06._M_str = in_stack_fffffffffffffec8;
        outputType_06._M_len = (size_t)in_stack_fffffffffffffec0;
        local_1e0 = &Federate::registerCloningFilter
                               (in_stack_fffffffffffffe90,filterName_05,in_stack_fffffffffffffe98,
                                outputType_06)->super_Filter;
      }
      else {
        local_f8 = local_18;
        local_f0 = local_10;
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_108);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_118);
        filterName_01._M_str._0_7_ = in_stack_fffffffffffffe50;
        filterName_01._M_len = (size_t)this_00;
        filterName_01._M_str._7_1_ = uVar2;
        inputType_02._M_str = (char *)this;
        inputType_02._M_len = in_RCX;
        outputType_02._M_str = in_stack_fffffffffffffe68;
        outputType_02._M_len = (size_t)in_stack_fffffffffffffe60;
        local_1e0 = &Federate::registerGlobalCloningFilter
                               (in_stack_fffffffffffffe30,filterName_01,inputType_02,outputType_02)
                     ->super_Filter;
      }
      local_8 = local_1e0;
    }
  }
  else if ((local_22 & 1) == 0) {
    if ((local_21 & 1) == 0) {
      local_c8 = local_18;
      local_c0 = local_10;
      local_d8 = this_00->_M_len;
      local_d0 = this_00->_M_str;
      local_e8 = this->_M_len;
      local_e0 = this->_M_str;
      filterName_04._M_str = in_stack_fffffffffffffeb0;
      filterName_04._M_len = in_stack_fffffffffffffea8;
      outputType_05._M_str = in_stack_fffffffffffffec8;
      outputType_05._M_len = (size_t)in_stack_fffffffffffffec0;
      local_1d8 = Federate::registerFilter
                            (in_stack_fffffffffffffe90,filterName_04,in_stack_fffffffffffffe98,
                             outputType_05);
    }
    else {
      local_98 = local_18;
      local_90 = local_10;
      local_a8 = this_00->_M_len;
      local_a0 = this_00->_M_str;
      local_b8 = this->_M_len;
      local_b0 = this->_M_str;
      filterName_00._M_str._0_7_ = in_stack_fffffffffffffe50;
      filterName_00._M_len = (size_t)this_00;
      filterName_00._M_str._7_1_ = (bool)uVar2;
      inputType_01._M_str = (char *)this;
      inputType_01._M_len = in_RCX;
      outputType_01._M_str = in_stack_fffffffffffffe68;
      outputType_01._M_len = (size_t)in_stack_fffffffffffffe60;
      local_1d8 = Federate::registerGlobalFilter
                            (in_stack_fffffffffffffe30,filterName_00,inputType_01,outputType_01);
    }
    local_8 = local_1d8;
  }
  else if ((local_21 & 1) == 0) {
    local_68 = local_18;
    local_60 = local_10;
    local_78 = this_00->_M_len;
    local_70 = this_00->_M_str;
    local_88 = this->_M_len;
    local_80 = this->_M_str;
    filterName_03._M_str = in_stack_fffffffffffffeb0;
    filterName_03._M_len = in_stack_fffffffffffffea8;
    outputType_04._M_str = in_stack_fffffffffffffec8;
    outputType_04._M_len = (size_t)in_stack_fffffffffffffec0;
    local_8 = &Federate::registerCloningFilter
                         (in_stack_fffffffffffffe90,filterName_03,in_stack_fffffffffffffe98,
                          outputType_04)->super_Filter;
  }
  else {
    local_38 = local_18;
    local_30 = local_10;
    local_48 = this_00->_M_len;
    local_40 = this_00->_M_str;
    local_58 = this->_M_len;
    local_50 = this->_M_str;
    filterName._M_str._0_7_ = in_stack_fffffffffffffe50;
    filterName._M_len = (size_t)this_00;
    filterName._M_str._7_1_ = (bool)uVar2;
    inputType_00._M_str = (char *)this;
    inputType_00._M_len = in_RCX;
    outputType_00._M_str = in_stack_fffffffffffffe68;
    outputType_00._M_len = (size_t)in_stack_fffffffffffffe60;
    local_8 = &Federate::registerGlobalCloningFilter
                         (in_stack_fffffffffffffe30,filterName,inputType_00,outputType_00)->
               super_Filter;
  }
  return local_8;
}

Assistant:

static Filter& registerFilter(Federate* fed,
                              bool global,
                              bool cloning,
                              std::string_view name,
                              std::string_view inputType,
                              std::string_view outputType)
{
    const bool useTypes = !((inputType.empty()) && (outputType.empty()));
    if (useTypes) {
        if (cloning) {
            return (global) ? fed->registerGlobalCloningFilter(name, inputType, outputType) :
                              fed->registerCloningFilter(name, inputType, outputType);
        }
        return (global) ? fed->registerGlobalFilter(name, inputType, outputType) :
                          fed->registerFilter(name, inputType, outputType);
    }
    if (cloning) {
        return (global) ? fed->registerGlobalCloningFilter(name) : fed->registerCloningFilter(name);
    }
    return (global) ? fed->registerGlobalFilter(name) : fed->registerFilter(name);
}